

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

TOK __thiscall Lexer::yylex0(Lexer *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  reference pcVar4;
  bool bVar5;
  string local_78 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pos;
  string local_40 [7];
  char ch_1;
  char local_19;
  Lexer *pLStack_18;
  char ch;
  Lexer *this_local;
  
  pLStack_18 = this;
LAB_0011cca9:
  while (iVar2 = isspace((int)this->yychar), iVar2 != 0) {
    yyinp(this);
  }
  this->yytokenlineno = this->yylineno;
  std::__cxx11::string::clear();
  if (this->yychar == '\0') {
    return T_EOF_SYMBOL;
  }
  local_19 = this->yychar;
  std::__cxx11::string::operator+=((string *)&this->yytext,local_19);
  yyinp(this);
  if ((local_19 == '%') && (this->yychar == '{')) {
    yyinp(this);
    skip(this,'{','{','}');
    lVar3 = std::__cxx11::string::length();
    std::__cxx11::string::string(local_40,(string *)&this->yytext,2,lVar3 - 4);
    std::__cxx11::string::operator=((string *)&this->yytext,local_40);
    std::__cxx11::string::~string(local_40);
    return T_TEXT;
  }
  if ((local_19 == '%') && (iVar2 = isalpha((int)this->yychar), iVar2 != 0)) {
    while( true ) {
      iVar2 = isalnum((int)this->yychar);
      bVar5 = true;
      if ((iVar2 == 0) && (bVar5 = true, this->yychar != '_')) {
        bVar5 = this->yychar == '-';
      }
      if (!bVar5) break;
      std::__cxx11::string::operator+=((string *)&this->yytext,this->yychar);
      yyinp(this);
    }
    bVar5 = std::operator==(&this->yytext,"%extern");
    if (bVar5) {
      return T_EXTERN;
    }
    bVar5 = std::operator==(&this->yytext,"%token-type");
    if (bVar5) {
      return T_TOKEN_TYPE;
    }
    bVar5 = std::operator==(&this->yytext,"%token");
    if (!bVar5) {
      bVar5 = std::operator==(&this->yytext,"%class");
      if (bVar5) {
        return T_CLASS;
      }
      bVar5 = std::operator==(&this->yytext,"%extends");
      if (!bVar5) {
        return T_ERROR;
      }
      return T_EXTENDS;
    }
    return T_TOKEN;
  }
  if (local_19 == '/') {
    if (this->yychar == '/') {
      while ((this->yychar != '\0' && (this->yychar != '\n'))) {
        yyinp(this);
      }
    }
    else {
      if (this->yychar != '*') {
        return T_SLASH;
      }
      yyinp(this);
      do {
        if (this->yychar == '\0') goto LAB_0011cca9;
        pos._M_current._7_1_ = this->yychar;
        yyinp(this);
      } while ((pos._M_current._7_1_ != '*') || (this->yychar != '/'));
      yyinp(this);
    }
    goto LAB_0011cca9;
  }
  if (local_19 != '\'') {
    if (local_19 == '{') {
      skip(this,'{','{','}');
      return T_CODE;
    }
    if (local_19 == '(') {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&this->yypos,2);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      if (*pcVar4 != '(') {
        __assert_fail("*pos == \'(\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/lexer.cc"
                      ,99,"TOK Lexer::yylex0()");
      }
      local_58._M_current = (char *)std::__cxx11::string::cbegin();
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
      bVar5 = false;
      if (bVar1) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator[](&local_50,-1);
        iVar2 = isalnum((int)*pcVar4);
        bVar5 = true;
        if (iVar2 == 0) {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator[](&local_50,-1);
          bVar5 = *pcVar4 == '_';
        }
      }
      if (!bVar5) {
        return T_LPAREN;
      }
      skip(this,local_19,'(',')');
      lVar3 = std::__cxx11::string::length();
      std::__cxx11::string::string(local_78,(string *)&this->yytext,1,lVar3 - 2);
      std::__cxx11::string::operator=((string *)&this->yytext,local_78);
      std::__cxx11::string::~string(local_78);
      return T_EXTRA;
    }
    if (local_19 == '#') {
      return T_POUND;
    }
    if (local_19 == ')') {
      return T_RPAREN;
    }
    if (local_19 == '*') {
      return T_STAR;
    }
    if (local_19 == '+') {
      return T_PLUS;
    }
    if (local_19 == ',') {
      return T_COMMA;
    }
    if (local_19 == ':') {
      return T_COLON;
    }
    if (local_19 == ';') {
      return T_SEMICOLON;
    }
    if (local_19 == '?') {
      return T_QUESTION;
    }
    if (local_19 == '|') {
      return T_BAR;
    }
    iVar2 = isalpha((int)local_19);
    if ((iVar2 == 0) && (local_19 != '_')) {
      return T_ERROR;
    }
    while( true ) {
      iVar2 = isalnum((int)this->yychar);
      bVar5 = true;
      if (iVar2 == 0) {
        bVar5 = this->yychar == '_';
      }
      if (!bVar5) break;
      std::__cxx11::string::operator+=((string *)&this->yytext,this->yychar);
      yyinp(this);
    }
    return T_IDENTIFIER;
  }
  std::__cxx11::string::operator=((string *)&this->yytext,'\'');
  while( true ) {
    bVar5 = false;
    if ((this->yychar != '\0') && (bVar5 = false, this->yychar != '\'')) {
      bVar5 = this->yychar != '\n';
    }
    if (!bVar5) break;
    if (this->yychar == '\\') {
      std::__cxx11::string::operator+=((string *)&this->yytext,this->yychar);
      yyinp(this);
      if ((this->yychar == '\0') || (this->yychar == '\n')) break;
    }
    std::__cxx11::string::operator+=((string *)&this->yytext,this->yychar);
    yyinp(this);
  }
  if (this->yychar != '\'') {
    return T_ERROR;
  }
  std::__cxx11::string::operator+=((string *)&this->yytext,this->yychar);
  yyinp(this);
  return T_CHAR_LITERAL;
}

Assistant:

TOK Lexer::yylex0() {
again:
  while (isspace(yychar)) yyinp();
  yytokenlineno = yylineno;
  yytext.clear();
  if (!yychar) return T_EOF_SYMBOL;
  auto ch = yychar;
  yytext += ch;
  yyinp();
  if (ch == '%' && yychar == '{') {
    yyinp();
    skip('{', '{', '}');
    yytext = std::string(yytext, 2, yytext.length() - 4);
    return T_TEXT;
  }
  if (ch == '%' && isalpha(yychar)) {
    while (isalnum(yychar) || yychar == '_' || yychar == '-') {
      yytext += yychar;
      yyinp();
    }
    if (yytext == "%extern") return T_EXTERN;
    if (yytext == "%token-type") return T_TOKEN_TYPE;
    if (yytext == "%token") return T_TOKEN;
    if (yytext == "%class") return T_CLASS;
    if (yytext == "%extends") return T_EXTENDS;
    return T_ERROR;
  }
  if (ch == '/') {
    if (yychar == '/') {
      for (; yychar; yyinp()) {
        if (yychar == '\n') break;
      }
      goto again;
    }
    if (yychar == '*') {
      yyinp();
      while (yychar) {
        auto ch = yychar;
        yyinp();
        if (ch == '*' && yychar == '/') {
          yyinp();
          break;
        }
      }
      goto again;
    }
    return T_SLASH;
  }
  if (ch == '\'') {
    yytext = ch;
    while (yychar && yychar != '\'' && yychar != '\n') {
      if (yychar == '\\') {
        yytext += yychar;
        yyinp();
        if (!yychar || yychar == '\n') break;
      }
      yytext += yychar;
      yyinp();
    }
    if (yychar != '\'') return T_ERROR;
    yytext += yychar;
    yyinp();
    return T_CHAR_LITERAL;
  }
  if (ch == '{') {
    skip(ch, '{', '}');
    return T_CODE;
  }
  if (ch == '(') {
    auto pos = yypos - 2;
    assert(*pos == '(');
    if (pos != yycode.cbegin() && (isalnum(pos[-1]) || pos[-1] == '_')) {
      skip(ch, '(', ')');
      yytext = std::string(yytext, 1, yytext.length() - 2);
      return T_EXTRA;
    }
    return T_LPAREN;
  }
  if (ch == '#') return T_POUND;
  if (ch == ')') return T_RPAREN;
  if (ch == '*') return T_STAR;
  if (ch == '+') return T_PLUS;
  if (ch == ',') return T_COMMA;
  if (ch == ':') return T_COLON;
  if (ch == ';') return T_SEMICOLON;
  if (ch == '?') return T_QUESTION;
  if (ch == '|') return T_BAR;
  if (isalpha(ch) || ch == '_') {
    while (isalnum(yychar) || yychar == '_') {
      yytext += yychar;
      yyinp();
    }
    return T_IDENTIFIER;
  }
  return T_ERROR;
}